

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void gen_gvec_op3_fpst(DisasContext_conflict1 *s,_Bool is_q,int rd,int rn,int rm,_Bool is_fp16,
                      int data,undefined1 *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_ptr ptr;
  undefined7 in_register_00000031;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  ptr = get_fpstatus_ptr_aarch64(tcg_ctx,is_fp16);
  tcg_gen_gvec_3_ptr_aarch64
            (tcg_ctx,rd * 0x100 + 0xc10,rn * 0x100 + 0xc10,rm * 0x100 + 0xc10,ptr,
             (int)CONCAT71(in_register_00000031,is_q) * 8 + 8,s->sve_len,data,fn);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ptr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_gvec_op3_fpst(DisasContext *s, bool is_q, int rd, int rn,
                              int rm, bool is_fp16, int data,
                              gen_helper_gvec_3_ptr *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                       vec_full_reg_offset(s, rn),
                       vec_full_reg_offset(s, rm), fpst,
                       is_q ? 16 : 8, vec_full_reg_size(s), data, fn);
    tcg_temp_free_ptr(tcg_ctx, fpst);
}